

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_fsqrt(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 dst;
  TCGv_i64 retval;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->fpu_enabled ^ 0xffU) & 1) == 0) {
    dst = tcg_temp_new_i64(tcg_ctx_00);
    retval = tcg_temp_new_i64(tcg_ctx_00);
    gen_reset_fpstatus(tcg_ctx_00);
    uVar1 = rB(ctx->opcode);
    get_fpr(tcg_ctx_00,dst,uVar1);
    gen_helper_fsqrt(tcg_ctx_00,retval,tcg_ctx_00->cpu_env,dst);
    uVar1 = rD(ctx->opcode);
    set_fpr(tcg_ctx_00,uVar1,retval);
    gen_compute_fprf_float64(tcg_ctx_00,retval);
    uVar1 = Rc(ctx->opcode);
    if (uVar1 != 0) {
      gen_set_cr1_from_fpscr(ctx);
    }
    tcg_temp_free_i64(tcg_ctx_00,dst);
    tcg_temp_free_i64(tcg_ctx_00,retval);
  }
  else {
    gen_exception(ctx,7);
  }
  return;
}

Assistant:

static void gen_fsqrt(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;                                   \
    TCGv_i64 t0;
    TCGv_i64 t1;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    gen_reset_fpstatus(tcg_ctx);
    get_fpr(tcg_ctx, t0, rB(ctx->opcode));
    gen_helper_fsqrt(tcg_ctx, t1, tcg_ctx->cpu_env, t0);
    set_fpr(tcg_ctx, rD(ctx->opcode), t1);
    gen_compute_fprf_float64(tcg_ctx, t1);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_cr1_from_fpscr(ctx);
    }
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}